

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_codim_mesh_data_set.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
operator()(AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this,
          Entity *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  pointer pvVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  iVar5 = (*(this->super_MeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>).
            _vptr_MeshDataSet[1])();
  if ((char)iVar5 == '\0') {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"MeshDataSet is not defined on this entity.",0x2a);
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DefinedOn(e)","");
    paVar2 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/all_codim_mesh_data_set.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_1e8,&local_208,0x39,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/all_codim_mesh_data_set.h"
               ,"");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    base::AssertionFailed(&local_1e8,&local_208,0x39,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    abort();
  }
  uVar6 = (**e->_vptr_Entity)(e);
  uVar7 = (ulong)uVar6;
  if (uVar7 < (this->data_).m_holder.m_size) {
    peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pvVar4 = (this->data_).m_holder.m_start;
    uVar6 = (*peVar3->_vptr_Mesh[5])(peVar3,e);
    if ((ulong)uVar6 < pvVar4[uVar7].m_holder.m_size) {
      return pvVar4[uVar7].m_holder.m_start + uVar6;
    }
    boost::assertion_failed
              ("this->m_holder.m_size > n",
               "reference boost::container::vector<std::vector<unsigned int>>::operator[](size_type) [T = std::vector<unsigned int>, A = void, Options = void]"
               ,
               "/root/.hunter/_Base/7456937/c3d17be/2b93a9d/Install/include/boost/container/vector.hpp"
               ,0x6cb);
  }
  boost::assertion_failed
            ("this->m_holder.m_size > n",
             "reference boost::container::vector<boost::container::vector<std::vector<unsigned int>>>::operator[](size_type) [T = boost::container::vector<std::vector<unsigned int>>, A = void, Options = void]"
             ,
             "/root/.hunter/_Base/7456937/c3d17be/2b93a9d/Install/include/boost/container/vector.hpp"
             ,0x6cb);
}

Assistant:

[[nodiscard]] T& operator()(const Entity& e) {
    LF_ASSERT_MSG(DefinedOn(e), "MeshDataSet is not defined on this entity.");
    return data_[e.Codim()][mesh_->Index(e)];
  }